

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall mean::~mean(mean *this)

{
  mean *this_local;
  
  ~mean(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        int n=x.size();
        grad_fn.resize(n);
        input = x;
        ret = new tensor(0);
        for(int i=0;i<input.size();i++){
            ret->data+=input[i]->data;
            grad_fn[i]=1.0/n;
            input[i]->cnt++;
            input[i]->cnt_free++;
        }
        ret->data/=n;
        ret->hook=this;
        return ret;
    }